

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmMakefileTargetGenerator::GetClangTidyReplacementsFilePath
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *directory,
          cmSourceFile *source,string *config)

{
  cmSourceFile *a;
  cmLocalGenerator *this_00;
  cmLocalGenerator *pcVar1;
  string *a_00;
  char local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  char local_a9;
  string local_a8;
  string local_88;
  char local_61;
  string local_60;
  undefined1 local_39;
  string *local_38;
  string *objectName;
  string *config_local;
  cmSourceFile *source_local;
  string *directory_local;
  cmMakefileTargetGenerator *this_local;
  string *fixesFile;
  
  objectName = config;
  config_local = (string *)source;
  source_local = (cmSourceFile *)directory;
  directory_local = (string *)this;
  this_local = (cmMakefileTargetGenerator *)__return_storage_ptr__;
  local_38 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,source);
  a = source_local;
  local_39 = 0;
  local_61 = '/';
  this_00 = cmGeneratorTarget::GetLocalGenerator
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar1 = cmGeneratorTarget::GetLocalGenerator
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  a_00 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
  local_a9 = '/';
  pcVar1 = cmGeneratorTarget::GetLocalGenerator
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  (*(pcVar1->super_cmOutputConverter)._vptr_cmOutputConverter[0x10])
            (&local_d0,pcVar1,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_d1 = '/';
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[6]>
            (&local_a8,a_00,&local_a9,&local_d0,&local_d1,local_38,(char (*) [6])0x1165d4c);
  cmOutputConverter::MaybeRelativeToTopBinDir(&local_88,&this_00->super_cmOutputConverter,&local_a8)
  ;
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string>
            (&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a,
             &local_61,&local_88);
  cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_d0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetClangTidyReplacementsFilePath(
  std::string const& directory, cmSourceFile const& source,
  std::string const& config) const
{
  (void)config;
  auto const& objectName = this->GeneratorTarget->GetObjectName(&source);
  auto fixesFile = cmSystemTools::CollapseFullPath(cmStrCat(
    directory, '/',
    this->GeneratorTarget->GetLocalGenerator()->MaybeRelativeToTopBinDir(
      cmStrCat(this->GeneratorTarget->GetLocalGenerator()
                 ->GetCurrentBinaryDirectory(),
               '/',
               this->GeneratorTarget->GetLocalGenerator()->GetTargetDirectory(
                 this->GeneratorTarget),
               '/', objectName, ".yaml"))));
  return fixesFile;
}